

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicState2::Run(BasicState2 *this)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_2d0 [8];
  VertexBindingState vb2;
  VertexAttribState va2;
  VertexBindingState vb5;
  VertexAttribState va5;
  VertexBindingState vb_1;
  VertexAttribState va_1;
  GLuint i_1;
  undefined1 local_c8 [8];
  VertexBindingState vb;
  VertexAttribState va;
  GLuint i;
  bool status;
  BasicState2 *this_local;
  
  bVar1 = true;
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  for (va.relative_offset = 0; (uint)va.relative_offset < 0x10;
      va.relative_offset = va.relative_offset + 1) {
    VertexAttribState::VertexAttribState((VertexAttribState *)&vb.index,va.relative_offset);
    VertexBindingState::VertexBindingState((VertexBindingState *)local_c8,va.relative_offset);
    glu::CallLogWrapper::glVertexAttribDivisor
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,va.relative_offset,va.relative_offset + 7);
    vb.offset._4_4_ = va.relative_offset + 7;
    bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb.index);
    if ((!bVar2) ||
       (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)local_c8), !bVar2)) {
      anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
      bVar1 = false;
    }
    VertexBindingState::~VertexBindingState((VertexBindingState *)local_c8);
    VertexAttribState::~VertexAttribState((VertexAttribState *)&vb.index);
  }
  for (va_1.relative_offset = 0; (uint)va_1.relative_offset < 0x10;
      va_1.relative_offset = va_1.relative_offset + 1) {
    VertexAttribState::VertexAttribState((VertexAttribState *)&vb_1.index,va_1.relative_offset);
    VertexBindingState::VertexBindingState
              ((VertexBindingState *)&va5.relative_offset,va_1.relative_offset);
    glu::CallLogWrapper::glVertexBindingDivisor
              (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,va_1.relative_offset,va_1.relative_offset);
    vb_1.offset._4_4_ = va_1.relative_offset;
    bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb_1.index);
    if ((!bVar2) ||
       (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)&va5.relative_offset), !bVar2)
       ) {
      anon_unknown_0::Output("glVertexBindingDivisor state change check failed.\n");
      bVar1 = false;
    }
    VertexBindingState::~VertexBindingState((VertexBindingState *)&va5.relative_offset);
    VertexAttribState::~VertexAttribState((VertexAttribState *)&vb_1.index);
  }
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,5);
  VertexAttribState::VertexAttribState((VertexAttribState *)&vb5.index,5);
  va5.array_normalized = 5;
  VertexBindingState::VertexBindingState((VertexBindingState *)&va2.relative_offset,5);
  vb5.offset._4_4_ = 5;
  VertexAttribState::VertexAttribState((VertexAttribState *)&vb2.index,2);
  va2.array_normalized = 5;
  VertexBindingState::VertexBindingState((VertexBindingState *)local_2d0,2);
  vb2.offset._4_4_ = 2;
  va2.array_pointer._4_4_ = 5;
  bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb5.index);
  if ((((!bVar2) ||
       (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar2)
       ) || (bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar2)) ||
     (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)local_2d0), !bVar2)) {
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
    bVar1 = false;
  }
  glu::CallLogWrapper::glVertexAttribDivisor
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,0x17);
  va2.array_pointer._4_4_ = 2;
  va2.array_normalized = 0x17;
  vb2.offset._4_4_ = 0x17;
  bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb5.index);
  if (((!bVar2) ||
      (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)&va2.relative_offset), !bVar2))
     || ((bVar2 = VertexAttribState::stateVerify((VertexAttribState *)&vb2.index), !bVar2 ||
         (bVar2 = VertexBindingState::stateVerify((VertexBindingState *)local_2d0), !bVar2)))) {
    anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
    bVar1 = false;
  }
  if (bVar1) {
    this_local = (BasicState2 *)0x0;
  }
  else {
    this_local = (BasicState2 *)&DAT_ffffffffffffffff;
  }
  VertexBindingState::~VertexBindingState((VertexBindingState *)local_2d0);
  VertexAttribState::~VertexAttribState((VertexAttribState *)&vb2.index);
  VertexBindingState::~VertexBindingState((VertexBindingState *)&va2.relative_offset);
  VertexAttribState::~VertexAttribState((VertexAttribState *)&vb5.index);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindVertexArray(m_vao);

		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexAttribDivisor(i, i + 7);
			va.array_divisor = i + 7;
			vb.divisor		 = i + 7;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexAttribDivisor state change check failed.\n");
				status = false;
			}
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexBindingDivisor(i, i);
			va.array_divisor = i;
			vb.divisor		 = i;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexBindingDivisor state change check failed.\n");
				status = false;
			}
		}

		glVertexAttribBinding(2, 5);
		VertexAttribState va5(5);
		va5.array_divisor = 5;
		VertexBindingState vb5(5);
		vb5.divisor = 5;
		VertexAttribState va2(2);
		va2.array_divisor = 5; // binding state seen thru mapping
		VertexBindingState vb2(2);
		vb2.divisor = 2;
		va2.binding = 5;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glVertexAttribDivisor(2, 23);
		va2.binding		  = 2; // glVAD defaults mapping
		va2.array_divisor = 23;
		vb2.divisor		  = 23;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribDivisor state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}